

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformation_t *
opengv::relative_pose::seventeenpt
          (transformation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double *pdVar1;
  double **ppdVar2;
  double **ppdVar3;
  size_t __size;
  MatrixVType *pMVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  transformation_t *ptVar67;
  int iVar68;
  double dVar69;
  long lVar70;
  void *pvVar71;
  double *pdVar72;
  undefined8 *puVar73;
  Index index_1;
  double dVar74;
  LhsNested pMVar75;
  ActualDstType actualDst;
  ulong uVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [16];
  size_t sVar79;
  ulong uVar80;
  int iVar81;
  Index index;
  size_t sVar82;
  ulong uVar83;
  long lVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  Scalar SVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar113;
  undefined1 auVar112 [16];
  undefined1 extraout_var [56];
  double dVar114;
  Packet2d mask;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  double __tmp;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  double __tmp_1;
  Packet2d mask_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  double dVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar173 [64];
  double dVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  double __tmp_4;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  double dVar186;
  undefined1 auVar187 [16];
  double __tmp_3;
  double dVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  MatrixXd SigmaInverse;
  Index size;
  bearingVector_t d1;
  MatrixXd PI;
  VectorXd sigma;
  Vector3d tb;
  MatrixXd B;
  MatrixXd SigmaInverse_;
  Vector3d ta;
  VectorXd fitb;
  VectorXd fita;
  MatrixXd AE;
  MatrixXd AR;
  VectorXd sigma_;
  MatrixXd A_trb;
  MatrixXd A_tra;
  MatrixXd ARP;
  MatrixXd E_temp;
  Matrix<double,_9,_1,_0,_9,_1> e;
  MatrixXd C;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDa;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDb;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDE;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDR;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDARP;
  Matrix3d W;
  DenseStorage<double,__1,__1,__1,_0> local_ed8;
  scalar_sum_op<double,_double> local_eb1;
  double local_eb0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_ea8;
  undefined1 (*local_e88) [16];
  undefined8 uStack_e80;
  ulong local_e70;
  DenseStorage<double,__1,__1,__1,_0> local_e68;
  double local_e48;
  undefined8 uStack_e40;
  Matrix<double,__1,_1,_0,__1,_1> local_e38;
  Matrix<double,__1,_1,_0,__1,_1> local_e28;
  Matrix<double,_3,_3,_0,_3,_3> local_e18;
  double dStack_dd0;
  undefined1 local_dc8 [16];
  double local_db8;
  double dStack_db0;
  double local_da8;
  double dStack_da0;
  double local_d98;
  double dStack_d90;
  double local_d88;
  DenseStorage<double,__1,__1,_1,_0> local_d78;
  undefined1 local_d68 [16];
  double local_d58 [2];
  DenseStorage<double,__1,__1,__1,_0> local_d48;
  DenseStorage<double,__1,__1,__1,_0> local_d28;
  Matrix<double,_3,_1,_0,_3,_1> local_d08;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_ce8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_cd8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_cc8;
  DenseStorage<double,__1,__1,__1,_0> local_cb8;
  double local_ca0;
  DenseStorage<double,__1,__1,__1,_0> local_c98;
  DenseStorage<double,__1,__1,_1,_0> local_c78;
  DenseStorage<double,__1,__1,__1,_0> local_c68;
  DenseStorage<double,__1,__1,__1,_0> local_c48;
  DenseStorage<double,__1,__1,__1,_0> local_c28;
  DenseStorage<double,__1,__1,__1,_0> local_c08;
  double local_be8 [4];
  double local_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  long local_b98;
  transformation_t *local_b90;
  undefined1 (*local_b88) [16];
  MatrixType local_b80;
  undefined1 local_b68 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_b50;
  DenseStorage<double,__1,__1,_1,_0> local_b38;
  double local_b28;
  undefined1 local_940 [64];
  undefined8 local_900;
  undefined1 local_8f8 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_8e0;
  double *local_8c8;
  ulong uStack_8c0;
  double local_8b8;
  undefined1 local_6d8 [544];
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_4b8;
  undefined1 local_298 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_280;
  DenseStorage<double,__1,__1,_1,_0> local_268;
  double local_258;
  undefined1 local_78 [64];
  undefined8 local_38;
  
  sVar79 = indices->_numberCorrespondences;
  local_cb8.m_cols = 0;
  local_cb8.m_data = (double *)0x0;
  local_cb8.m_rows = 0;
  if (0xe38e38e38e38e38 < (long)sVar79) {
    puVar73 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar73 = acos;
    __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  lVar84 = sVar79 * 9;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_cb8,lVar84,sVar79,9);
  local_c98.m_data = (double *)0x0;
  local_c98.m_rows = 0;
  local_c98.m_cols = 0;
  local_e88 = (undefined1 (*) [16])lVar84;
  local_b90 = __return_storage_ptr__;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c98,lVar84,sVar79,9);
  auVar86 = in_ZMM14._0_16_;
  local_e48 = (double)sVar79;
  if (sVar79 != 0) {
    lVar84 = 0;
    sVar79 = 0;
    do {
      iVar81 = (int)sVar79;
      lVar70 = lVar84 >> 0x1e;
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_4b8,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_b68,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(local_8f8,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(local_be8,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(local_298,adapter,(long)iVar68);
      if (indices->_useIndices != false) {
        iVar81 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(local_6d8,adapter,(long)iVar81);
      auVar86 = in_ZMM14._0_16_;
      auVar44._8_8_ = local_6d8._32_8_;
      auVar44._0_8_ = local_6d8._24_8_;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_8f8._16_8_;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = local_8f8._0_8_;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = local_be8[2];
      auVar192._8_8_ = 0;
      auVar192._0_8_ = local_be8[0];
      auVar85._8_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      auVar85._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      auVar85 = vmulpd_avx512vl(local_298._0_16_,auVar85);
      auVar43._8_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      auVar43._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      auVar85 = vfmadd132pd_avx512vl
                          ((undefined1  [16])
                           local_280.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage._0_16_,auVar85,auVar43);
      auVar115._8_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar115._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar115 = vfmadd231pd_fma(auVar85,auVar115,(undefined1  [16])local_268);
      dVar114 = (double)local_4b8.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                        .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data * (double)local_298._16_8_ +
                (double)local_4b8.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                        .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows *
                (double)local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols +
                (double)local_4b8.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                        .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols * local_258;
      auVar89._8_8_ = local_6d8._8_8_;
      auVar89._0_8_ = local_6d8._0_8_;
      auVar87._8_8_ = local_b68._0_8_;
      auVar87._0_8_ = local_b68._0_8_;
      auVar85 = vmulpd_avx512vl(auVar89,auVar87);
      auVar88._8_8_ = local_b68._8_8_;
      auVar88._0_8_ = local_b68._8_8_;
      auVar85 = vfmadd132pd_avx512vl(auVar44,auVar85,auVar88);
      auVar129._8_8_ = local_b68._16_8_;
      auVar129._0_8_ = local_b68._16_8_;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = (double)local_8f8._0_8_ * dVar114;
      auVar89 = vfmsub231sd_fma(auVar157,auVar115,auVar187);
      auVar87 = vfmadd231pd_fma(auVar85,auVar129,local_6d8._48_16_);
      auVar85 = vshufpd_avx(auVar115,auVar115,1);
      dVar145 = auVar85._0_8_;
      auVar43 = vshufpd_avx(auVar87,auVar87,1);
      dVar186 = auVar43._0_8_;
      dVar69 = (double)local_b68._0_8_ * (double)local_6d8._16_8_ +
               (double)local_b68._8_8_ * (double)local_6d8._40_8_ +
               (double)local_b68._16_8_ * (double)local_6d8._64_8_;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = local_8f8._8_8_;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = local_be8[0] * dVar69;
      auVar88 = vfmsub231sd_fma(auVar189,auVar87,auVar200);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = dVar114;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = (double)local_8f8._16_8_ * dVar145;
      auVar44 = vfmsub231sd_fma(auVar168,auVar139,auVar116);
      in_ZMM6 = ZEXT1664(auVar44);
      dVar74 = auVar115._0_8_;
      dVar188 = auVar88._0_8_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = dVar74 * (double)local_8f8._8_8_;
      auVar116 = vfmsub231sd_fma(auVar140,auVar85,auVar178);
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_be8[1];
      auVar201._8_8_ = 0;
      auVar201._0_8_ = dVar188 * dVar74;
      auVar85 = vfmadd231sd_fma(auVar201,auVar43,auVar44);
      auVar130._8_8_ = 0;
      auVar130._0_8_ = dVar69;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = dVar186 * local_be8[2];
      auVar115 = vfmsub231sd_fma(auVar203,auVar179,auVar130);
      dVar174 = auVar87._0_8_;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = local_be8[1] * dVar174;
      auVar88 = vfmsub231sd_fma(auVar180,auVar43,auVar192);
      local_cb8.m_data[sVar79] = dVar74 * dVar174;
      local_cb8.m_data[sVar79 + local_cb8.m_rows] = dVar145 * dVar174;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 2] = dVar114 * dVar174;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 3] = dVar186 * dVar74;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 4] = dVar186 * dVar145;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 5] = dVar186 * dVar114;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 6] = dVar74 * dVar69;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 7] = dVar145 * dVar69;
      local_cb8.m_data[sVar79 + local_cb8.m_rows * 8] = dVar114 * dVar69;
      dVar174 = auVar115._0_8_;
      dVar69 = auVar88._0_8_;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = dVar174 * dVar74;
      auVar115 = vfmadd231sd_fma(auVar193,auVar87,auVar44);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = dVar69 * dVar74;
      auVar88 = vfmadd231sd_fma(auVar98,auVar130,auVar44);
      local_c98.m_data[sVar79] = auVar115._0_8_;
      sVar82 = sVar79 + 1;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = dVar174 * dVar145;
      auVar115 = vfmadd231sd_fma(auVar194,auVar87,auVar89);
      local_c98.m_data[sVar79 + local_c98.m_rows] = auVar115._0_8_;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = dVar174 * dVar114;
      auVar115 = vfmadd231sd_fma(auVar195,auVar116,auVar87);
      local_c98.m_data[sVar79 + local_c98.m_rows * 2] = auVar115._0_8_;
      local_c98.m_data[sVar79 + local_c98.m_rows * 3] = auVar85._0_8_;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = dVar188 * dVar145;
      auVar85 = vfmadd231sd_fma(auVar196,auVar43,auVar89);
      auVar190._8_8_ = 0;
      auVar190._0_8_ = dVar188 * dVar114;
      auVar43 = vfmadd231sd_fma(auVar190,auVar116,auVar43);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = dVar69 * dVar145;
      auVar115 = vfmadd231sd_fma(auVar146,auVar130,auVar89);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = dVar69 * dVar114;
      auVar87 = vfmadd231sd_fma(auVar117,auVar130,auVar116);
      local_c98.m_data[sVar79 + local_c98.m_rows * 4] = auVar85._0_8_;
      local_c98.m_data[sVar79 + local_c98.m_rows * 5] = auVar43._0_8_;
      local_c98.m_data[sVar79 + local_c98.m_rows * 6] = auVar88._0_8_;
      local_c98.m_data[sVar79 + local_c98.m_rows * 7] = auVar115._0_8_;
      local_c98.m_data[sVar79 + local_c98.m_rows * 8] = auVar87._0_8_;
      lVar84 = lVar84 + 0x100000000;
      sVar79 = sVar82;
    } while (local_e48 != (double)sVar82);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298,
             (MatrixType *)&local_c98,0x28);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_c78,&local_268);
  auVar86 = vcvtusi2sd_avx512f(auVar86,local_e48);
  local_ca0 = auVar86._0_8_;
  local_eb0 = local_ca0 * *local_c78.m_data;
  local_d28.m_cols = 0;
  local_d28.m_data = (double *)0x0;
  local_d28.m_rows = 0;
  lVar84 = 0x51;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_d28,0x51,9,9);
  if ((local_d28.m_rows == 9) && (local_d28.m_cols == 9)) {
LAB_0013622a:
    memset(local_d28.m_data,0,lVar84 << 3);
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_d28,0x51,9,9);
    lVar84 = local_d28.m_cols * local_d28.m_rows;
    if (0 < lVar84) goto LAB_0013622a;
  }
  dVar114 = local_e48;
  lVar84 = 0;
  pdVar72 = local_d28.m_data;
  do {
    if (local_eb0 * 2.220446049250313e-16 < local_c78.m_data[lVar84]) {
      *pdVar72 = 1.0 / local_c78.m_data[lVar84];
    }
    lVar84 = lVar84 + 1;
    pdVar72 = pdVar72 + local_d28.m_rows + 1;
  } while (lVar84 != 9);
  local_c28.m_cols = 0;
  local_c28.m_data = (double *)0x0;
  local_c28.m_rows = 0;
  if ((local_e48 != 0.0) &&
     (auVar86 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar86 / SEXT816((long)local_e48),0) < 9)) {
    puVar73 = (undefined8 *)
              __cxa_allocate_exception(8,9,SUB168(auVar86 % SEXT816((long)local_e48),0));
    *puVar73 = acos;
    __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c28,(Index)local_e88,9,(Index)local_e48)
  ;
  local_6d8._0_8_ = &local_280;
  local_6d8._8_8_ = &local_d28;
  local_6d8._16_8_ = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_c28,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_6d8,(assign_op<double,_double> *)&local_4b8,(type)0x0);
  local_d48.m_cols = 0;
  local_d48.m_data = (double *)0x0;
  local_d48.m_rows = 0;
  if ((dVar114 != 0.0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)dVar114),0) <
      (long)dVar114)) {
    puVar73 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar73 = acos;
    __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_d48,(long)dVar114 * (long)dVar114,(Index)dVar114,(Index)dVar114);
  if (((double)local_d48.m_rows != dVar114) ||
     (dVar69 = local_e48, dVar74 = local_e48, (double)local_d48.m_cols != local_e48)) {
    if ((local_e48 != 0.0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_e48),0) <
        (long)local_e48)) {
      puVar73 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar73 = acos;
      __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_d48,(long)dVar114 * (long)dVar114,(Index)local_e48,(Index)local_e48);
    dVar69 = (double)local_d48.m_rows;
    dVar74 = (double)local_d48.m_cols;
  }
  if (0 < (long)dVar74) {
    auVar90 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
    auVar91 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar92 = vpbroadcastq_avx512f(ZEXT816(8));
    sVar79 = 0;
    auVar93 = vpbroadcastq_avx512f();
    pdVar72 = local_d48.m_data;
    do {
      if (0 < (long)dVar69) {
        auVar94 = vpbroadcastq_avx512f();
        uVar80 = 0;
        auVar95 = vmovdqa64_avx512f(auVar91);
        auVar173 = in_ZMM6;
        do {
          uVar77 = vpcmpeqq_avx512f(auVar95,auVar94);
          auVar96._8_8_ = 0xbff0000000000000;
          auVar96._0_8_ = 0xbff0000000000000;
          auVar96._16_8_ = 0xbff0000000000000;
          auVar96._24_8_ = 0xbff0000000000000;
          auVar96._32_8_ = 0xbff0000000000000;
          auVar96._40_8_ = 0xbff0000000000000;
          auVar96._48_8_ = 0xbff0000000000000;
          auVar96._56_8_ = 0xbff0000000000000;
          auVar96 = vblendmpd_avx512f(auVar90,auVar96);
          bVar36 = (bool)((byte)uVar77 & 1);
          in_ZMM6._0_8_ = (ulong)bVar36 * auVar96._0_8_ | (ulong)!bVar36 * auVar173._0_8_;
          bVar36 = (bool)((byte)(uVar77 >> 1) & 1);
          in_ZMM6._8_8_ = (ulong)bVar36 * auVar96._8_8_ | (ulong)!bVar36 * auVar173._8_8_;
          bVar36 = (bool)((byte)(uVar77 >> 2) & 1);
          in_ZMM6._16_8_ = (ulong)bVar36 * auVar96._16_8_ | (ulong)!bVar36 * auVar173._16_8_;
          bVar36 = (bool)((byte)(uVar77 >> 3) & 1);
          in_ZMM6._24_8_ = (ulong)bVar36 * auVar96._24_8_ | (ulong)!bVar36 * auVar173._24_8_;
          bVar36 = (bool)((byte)(uVar77 >> 4) & 1);
          in_ZMM6._32_8_ = (ulong)bVar36 * auVar96._32_8_ | (ulong)!bVar36 * auVar173._32_8_;
          bVar36 = (bool)((byte)(uVar77 >> 5) & 1);
          in_ZMM6._40_8_ = (ulong)bVar36 * auVar96._40_8_ | (ulong)!bVar36 * auVar173._40_8_;
          bVar36 = (bool)((byte)(uVar77 >> 6) & 1);
          in_ZMM6._48_8_ = (ulong)bVar36 * auVar96._48_8_ | (ulong)!bVar36 * auVar173._48_8_;
          in_ZMM6._56_8_ =
               (uVar77 >> 7) * auVar96._56_8_ | (ulong)!SUB81(uVar77 >> 7,0) * auVar173._56_8_;
          uVar77 = vpcmpuq_avx512f(auVar95,auVar93,2);
          auVar95 = vpaddq_avx512f(auVar95,auVar92);
          pdVar1 = pdVar72 + uVar80;
          bVar36 = (bool)((byte)uVar77 & 1);
          bVar37 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar38 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar39 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar40 = (bool)((byte)(uVar77 >> 4) & 1);
          bVar41 = (bool)((byte)(uVar77 >> 5) & 1);
          bVar42 = (bool)((byte)(uVar77 >> 6) & 1);
          *pdVar1 = (double)(bVar36 * in_ZMM6._0_8_ | (ulong)!bVar36 * (long)*pdVar1);
          pdVar1[1] = (double)(bVar37 * in_ZMM6._8_8_ | (ulong)!bVar37 * (long)pdVar1[1]);
          pdVar1[2] = (double)(bVar38 * in_ZMM6._16_8_ | (ulong)!bVar38 * (long)pdVar1[2]);
          pdVar1[3] = (double)(bVar39 * in_ZMM6._24_8_ | (ulong)!bVar39 * (long)pdVar1[3]);
          pdVar1[4] = (double)(bVar40 * in_ZMM6._32_8_ | (ulong)!bVar40 * (long)pdVar1[4]);
          pdVar1[5] = (double)(bVar41 * in_ZMM6._40_8_ | (ulong)!bVar41 * (long)pdVar1[5]);
          pdVar1[6] = (double)(bVar42 * in_ZMM6._48_8_ | (ulong)!bVar42 * (long)pdVar1[6]);
          pdVar1[7] = (double)((uVar77 >> 7) * in_ZMM6._56_8_ |
                              (ulong)!SUB81(uVar77 >> 7,0) * (long)pdVar1[7]);
          uVar80 = uVar80 + 8;
          auVar173 = in_ZMM6;
        } while (((long)dVar69 + 7U & 0xfffffffffffffff8) != uVar80);
      }
      sVar79 = sVar79 + 1;
      pdVar72 = pdVar72 + (long)dVar69;
    } while ((double)sVar79 != dVar74);
  }
  local_6d8._8_8_ = &local_c98;
  local_6d8._0_8_ = &local_d48;
  local_6d8._16_8_ = &local_c28;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_d48,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_6d8,(assign_op<double,_double> *)&local_4b8,(type)0x0);
  local_6d8._8_8_ = &local_cb8;
  local_6d8._0_8_ = &local_d48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b80,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_6d8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_6d8,&local_b80,0x28);
  local_be8[0] = *(double *)(local_6d8._24_8_ + local_6d8._32_8_ * 8 * 8);
  local_be8[1] = ((double *)(local_6d8._24_8_ + local_6d8._32_8_ * 8 * 8))[1];
  local_be8[2] = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 2) * 8);
  local_be8[3] = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 2) * 8))[1];
  local_bc8 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 4) * 8);
  dStack_bc0 = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 4) * 8))[1];
  local_bb8 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 6) * 8);
  dStack_bb0 = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 6) * 8))[1];
  local_ba8 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 8) * 8);
  local_c08.m_cols = 0;
  local_c08.m_data = (double *)0x0;
  local_c08.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c08,9,3,3);
  local_e88 = (undefined1 (*) [16])local_c08.m_data;
  uVar80 = local_c08.m_rows;
  if ((((ulong)local_c08.m_data & 7) == 0) &&
     (uVar80 = (ulong)(-((uint)((ulong)local_c08.m_data >> 3) & 0x1fffffff) & 7),
     local_c08.m_rows <= (long)uVar80)) {
    uVar80 = local_c08.m_rows;
  }
  uVar83 = local_c08.m_rows - uVar80;
  local_eb0 = (double)local_c08.m_rows;
  uVar77 = uVar83 + 7;
  if (-1 < (long)uVar83) {
    uVar77 = uVar83;
  }
  uVar76 = uVar77 & 0xfffffffffffffff8;
  if (0 < (long)uVar80) {
    memcpy(local_c08.m_data,local_be8,uVar80 * 8);
  }
  lVar84 = uVar76 + uVar80;
  local_e70 = uVar76;
  if (7 < (long)uVar83) {
    lVar70 = uVar80 + 8;
    if ((long)(uVar80 + 8) < lVar84) {
      lVar70 = lVar84;
    }
    memcpy(*local_e88 + uVar80 * 8,local_be8 + uVar80,
           (~uVar80 + lVar70 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar84 < (long)local_eb0) {
    memcpy(local_e88[((long)uVar77 >> 3) * 4] + uVar80 * 8,
           local_be8 + uVar80 + ((long)uVar77 >> 3) * 8,(uVar83 - local_e70) * 8);
  }
  pauVar78 = (undefined1 (*) [16])(*local_e88 + (long)local_eb0 * 8);
  dVar114 = local_eb0;
  if ((((ulong)pauVar78 & 7) == 0) &&
     (dVar114 = (double)(ulong)(-((uint)((ulong)pauVar78 >> 3) & 0x1fffffff) & 7),
     (long)local_eb0 <= (long)dVar114)) {
    dVar114 = local_eb0;
  }
  uVar77 = (long)local_eb0 - (long)dVar114;
  uVar80 = uVar77 + 7;
  if (-1 < (long)uVar77) {
    uVar80 = uVar77;
  }
  local_e70 = uVar80 & 0xfffffffffffffff8;
  if (0 < (long)dVar114) {
    memcpy(pauVar78,local_be8 + 3,(long)dVar114 * 8);
  }
  lVar84 = local_e70 + (long)dVar114;
  local_b88 = pauVar78;
  if (7 < (long)uVar77) {
    lVar70 = (long)dVar114 + 8U;
    if ((long)((long)dVar114 + 8U) < lVar84) {
      lVar70 = lVar84;
    }
    memcpy(*local_e88 + ((long)dVar114 + (long)local_eb0) * 8,local_be8 + (long)dVar114 + 3,
           (~(ulong)dVar114 + lVar70 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar84 < (long)local_eb0) {
    memcpy(local_e88[((long)uVar80 >> 3) * 4] + (long)local_eb0 * 8 + (long)dVar114 * 8,
           local_be8 + (long)dVar114 + ((long)uVar80 >> 3) * 8 + 3,(uVar77 - local_e70) * 8);
  }
  pauVar78 = local_e88 + (long)local_eb0;
  dVar114 = local_eb0;
  if ((((ulong)pauVar78 & 7) == 0) &&
     (dVar114 = (double)(ulong)(-((uint)((ulong)pauVar78 >> 3) & 0x1fffffff) & 7),
     (long)local_eb0 <= (long)dVar114)) {
    dVar114 = local_eb0;
  }
  uVar77 = (long)local_eb0 - (long)dVar114;
  uVar80 = uVar77 + 7;
  if (-1 < (long)uVar77) {
    uVar80 = uVar77;
  }
  local_e70 = uVar80 & 0xfffffffffffffff8;
  if (0 < (long)dVar114) {
    memcpy(pauVar78,local_be8 + 6,(long)dVar114 * 8);
  }
  lVar84 = local_e70 + (long)dVar114;
  if (7 < (long)uVar77) {
    lVar70 = (long)dVar114 + 8U;
    if ((long)((long)dVar114 + 8U) < lVar84) {
      lVar70 = lVar84;
    }
    local_b98 = lVar84;
    memcpy(*pauVar78 + (long)dVar114 * 8,local_be8 + (long)dVar114 + 6,
           (~(ulong)dVar114 + lVar70 & 0xfffffffffffffff8) * 8 + 0x40);
    lVar84 = local_b98;
  }
  if (lVar84 < (long)local_eb0) {
    memcpy(pauVar78[((long)uVar80 >> 3) * 4] + (long)dVar114 * 8,
           local_be8 + ((long)uVar80 >> 3) * 8 + (long)dVar114 + 6,(uVar77 - local_e70) * 8);
  }
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)local_e88[1];
  auVar90 = vbroadcastsd_avx512f(auVar86);
  auVar90 = vpermi2pd_avx512f(_DAT_00250640,ZEXT2464(CONCAT816(auVar90._16_8_,*local_e88)),
                              ZEXT1664(*local_b88));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)local_b88[1];
  auVar91 = vbroadcastsd_avx512f(auVar5);
  auVar92._0_40_ = auVar90._0_40_;
  auVar92._40_8_ = auVar91._40_8_;
  auVar92._48_8_ = auVar90._48_8_;
  auVar92._56_8_ = auVar90._56_8_;
  local_940 = vpermi2pd_avx512f(_DAT_00250680,auVar92,ZEXT1664(*pauVar78));
  local_900 = *(undefined8 *)pauVar78[1];
  local_b68._16_8_ = 0;
  local_b68._0_8_ = (LhsNested)0x0;
  local_b68._8_8_ = (RhsNested)0x0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_b68,9,3,3);
  if (((RhsNested)local_b68._8_8_ == (RhsNested)0x3) && (local_b68._16_8_ == 3)) {
    uVar77 = 9;
    uVar80 = 8;
LAB_0013696c:
    pMVar75 = (LhsNested)local_b68._0_8_;
    uVar83 = 8;
    if (8 < (long)uVar80) {
      uVar83 = uVar80;
    }
    memcpy((void *)local_b68._0_8_,local_940,uVar83 * 8);
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)local_b68,9,3,3);
    uVar77 = local_b68._16_8_ * local_b68._8_8_;
    uVar80 = uVar77 + 7;
    if (-1 < (long)uVar77) {
      uVar80 = uVar77;
    }
    uVar80 = uVar80 & 0xfffffffffffffff8;
    pMVar75 = (LhsNested)local_b68._0_8_;
    if (7 < (long)uVar77) goto LAB_0013696c;
  }
  if ((long)uVar80 < (long)uVar77) {
    do {
      (&(pMVar75->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      )[uVar80] = *(double **)(local_940 + uVar80 * 8);
      uVar80 = uVar80 + 1;
    } while (uVar77 != uVar80);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_4b8,(MatrixType *)local_b68,0x14);
  if ((LhsNested)local_b68._0_8_ != (LhsNested)0x0) {
    free((void *)(((LhsNested)(local_b68._0_8_ + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  local_78._0_24_ = SUB6424(ZEXT864(0),0) << 0x40;
  pMVar4 = &local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
            m_matrixV;
  local_78._24_8_ = 0xbff0000000000000;
  auVar86 = local_78._16_16_;
  local_78._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
  local_78 = ZEXT3264(CONCAT1616(auVar86,local_78._0_16_));
  local_38 = 0x3ff0000000000000;
  local_b68._0_8_ = &local_4b8;
  local_b68._8_8_ = (RhsNested)local_78;
  local_b68._16_8_ = pMVar4;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_dc8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)local_b68,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_b68 + 0x10));
  local_b68._0_8_ = &local_4b8;
  local_b68._8_8_ = (RhsNested)local_78;
  local_b68._16_8_ = pMVar4;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_e18,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
              *)local_b68,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_b68 + 0x10));
  dVar69 = local_e48;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dStack_da0;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_da8;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = local_d88;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_dc8._8_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dStack_da0 * dStack_d90;
  auVar86 = vfmsub231sd_fma(auVar99,auVar169,auVar175);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_db8 * dStack_d90;
  auVar85 = vfmsub231sd_fma(auVar181,auVar158,auVar175);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = local_db8 * local_da8;
  auVar43 = vfmsub231sd_fma(auVar170,auVar158,auVar147);
  dVar114 = (double)local_dc8._8_8_;
  if ((auVar86._0_8_ * (double)local_dc8._0_8_ - auVar85._0_8_ * dStack_db0) +
      local_d98 * auVar43._0_8_ < 0.0) {
    auVar148._0_8_ = -(double)local_dc8._0_8_;
    auVar148._8_8_ = -(double)local_dc8._8_8_;
    auVar86 = vshufps_avx(auVar148,auVar148,0x4e);
    dVar114 = auVar86._0_8_;
    auVar182._0_8_ = -local_da8;
    auVar182._8_8_ = -dStack_da0;
    auVar100._0_8_ = -local_db8;
    auVar100._8_8_ = -dStack_db0;
    auVar86 = vshufps_avx(auVar100,auVar100,0x4e);
    dStack_db0 = auVar86._0_8_;
    auVar86 = vshufps_avx(auVar182,auVar182,0x4e);
    dStack_da0 = auVar86._0_8_;
    auVar141._0_8_ = -local_d98;
    auVar141._8_8_ = -dStack_d90;
    auVar45._8_8_ = 0x8000000000000000;
    auVar45._0_8_ = 0x8000000000000000;
    auVar86 = vxorpd_avx512vl(auVar175,auVar45);
    local_d88 = (double)vmovlpd_avx(auVar86);
    auVar86 = vshufps_avx(auVar141,auVar141,0x4e);
    dStack_d90 = auVar86._0_8_;
    local_db8 = auVar100._0_8_;
    local_d98 = auVar141._0_8_;
    local_da8 = auVar182._0_8_;
    local_dc8._0_8_ = auVar148._0_8_;
  }
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar86 = vfmsub231sd_fma(auVar176,auVar206,auVar204);
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
  auVar85 = vfmsub231sd_fma(auVar208,auVar202,auVar204);
  auVar207._8_8_ = 0;
  auVar207._0_8_ =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
  auVar43 = vfmsub231sd_fma(auVar207,auVar202,auVar197);
  dVar74 = local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
  if (local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] * auVar43._0_8_ +
      (auVar86._0_8_ *
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] - local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] * auVar85._0_8_) < 0.0) {
    auVar46._8_8_ = 0x8000000000000000;
    auVar46._0_8_ = 0x8000000000000000;
    auVar85 = vxorpd_avx512vl(auVar204,auVar46);
    auVar183._0_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
    auVar183._8_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1];
    auVar86 = vshufps_avx(auVar183,auVar183,0x4e);
    dVar74 = auVar86._0_8_;
    auVar198._0_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4];
    auVar198._8_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5];
    auVar177._0_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2];
    auVar177._8_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3];
    auVar86 = vshufps_avx(auVar198,auVar198,0x4e);
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = auVar86._0_8_;
    auVar191._0_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6];
    auVar191._8_8_ =
         -local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7];
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = (double)vmovlpd_avx(auVar85);
    auVar86 = vshufps_avx(auVar177,auVar177,0x4e);
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = auVar86._0_8_;
    auVar86 = vshufps_avx(auVar191,auVar191,0x4e);
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = auVar86._0_8_;
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = auVar177._0_8_;
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = auVar191._0_8_;
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = auVar198._0_8_;
    local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = auVar183._0_8_;
  }
  lVar84 = (long)local_e48 * 3;
  local_dc8._8_8_ = dStack_db0;
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_c48.m_data = (double *)0x0;
  local_c48.m_rows = 0;
  local_c48.m_cols = 0;
  dVar145 = local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       dVar74;
  dVar74 = local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       dVar145;
  local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       dVar74;
  dVar74 = local_db8;
  local_db8 = local_d98;
  dStack_db0 = dVar114;
  dVar114 = dStack_da0;
  dStack_da0 = dStack_d90;
  local_d98 = dVar74;
  dStack_d90 = dVar114;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c48,lVar84,(Index)local_e48,3);
  local_c68.m_data = (double *)0x0;
  local_c68.m_rows = 0;
  local_c68.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c68,lVar84,(Index)dVar69,3);
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_eb0 = (double)lVar84;
  if (dVar69 == 0.0) {
    local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar69;
  }
  else {
    if ((long)dVar69 < 1) {
      local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)dVar69;
    }
    else {
      __size = (long)dVar69 * 8 + 0x40;
      pvVar71 = malloc(__size);
      if (pvVar71 == (void *)0x0) {
        puVar73 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar73 = acos;
        __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar71 & 0xffffffffffffffc0) + 0x38) = pvVar71;
      local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(((ulong)pvVar71 & 0xffffffffffffffc0) + 0x40);
      local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)dVar69;
      pvVar71 = malloc(__size);
      if (pvVar71 == (void *)0x0) {
        puVar73 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar73 = acos;
        __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar71 & 0xffffffffffffffc0) + 0x38) = pvVar71;
      local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(((ulong)pvVar71 & 0xffffffffffffffc0) + 0x40);
    }
    local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar69;
    lVar84 = 0;
    sVar79 = 0;
    local_e88 = (undefined1 (*) [16])0x8000000000000000;
    uStack_e80 = 0x8000000000000000;
    do {
      iVar81 = (int)sVar79;
      lVar70 = lVar84 >> 0x1e;
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_ea8,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_ed8,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&local_e68,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&local_d08,adapter,(long)iVar68);
      iVar68 = iVar81;
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(local_b68,adapter,(long)iVar68);
      if (indices->_useIndices != false) {
        iVar81 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar70);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(local_8f8,adapter,(long)iVar81);
      auVar64._8_8_ = local_b68._8_8_;
      auVar64._0_8_ = local_b68._0_8_;
      auVar47._8_8_ = local_ea8.m_lhs.m_lhs;
      auVar47._0_8_ = local_ea8.m_lhs.m_lhs;
      auVar86 = vmulpd_avx512vl(auVar64,auVar47);
      dVar114 = (double)local_ea8.m_lhs.m_rhs *
                (double)local_b50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols;
      dVar69 = (double)local_ea8.m_lhs.m_lhs * (double)local_b68._16_8_;
      dVar74 = (double)local_ed8.m_rows *
               (double)local_8e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols;
      dVar145 = (double)local_ed8.m_data * (double)local_8f8._16_8_;
      auVar48._8_8_ = local_ea8.m_lhs.m_rhs;
      auVar48._0_8_ = local_ea8.m_lhs.m_rhs;
      auVar86 = vfmadd132pd_avx512vl
                          ((undefined1  [16])
                           local_b50.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage._0_16_,auVar86,auVar48);
      auVar101._8_8_ = local_ea8.m_rhs;
      auVar101._0_8_ = local_ea8.m_rhs;
      auVar86 = vfmadd231pd_fma(auVar86,auVar101,(undefined1  [16])local_b38);
      local_ea8.m_lhs.m_lhs = auVar86._0_8_;
      local_ea8.m_lhs.m_rhs = auVar86._8_8_;
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      local_ea8.m_rhs = (RhsNested)(dVar69 + dVar114 + (double)local_ea8.m_rhs * local_b28);
      auVar65._8_8_ = local_8f8._8_8_;
      auVar65._0_8_ = local_8f8._0_8_;
      auVar49._8_8_ = local_ed8.m_data;
      auVar49._0_8_ = local_ed8.m_data;
      auVar85 = vmulpd_avx512vl(auVar65,auVar49);
      auVar50._8_8_ = local_ed8.m_rows;
      auVar50._0_8_ = local_ed8.m_rows;
      auVar85 = vfmadd132pd_avx512vl
                          ((undefined1  [16])
                           local_8e0.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage._0_16_,auVar85,auVar50);
      auVar131._8_8_ = local_ed8.m_cols;
      auVar131._0_8_ = local_ed8.m_cols;
      auVar66._8_8_ = uStack_8c0;
      auVar66._0_8_ = local_8c8;
      auVar43 = vfmadd231pd_fma(auVar85,auVar131,auVar66);
      auVar85 = vshufpd_avx(auVar43,auVar43,1);
      local_ed8.m_data = auVar43._0_8_;
      local_ed8.m_rows = auVar43._8_8_;
      local_ed8.m_cols = (Index)(dVar145 + dVar74 + (double)local_ed8.m_cols * local_8b8);
      dVar114 = auVar86._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_dc8._8_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = (double)local_ea8.m_rhs * (double)local_ed8.m_data;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = (double)local_ea8.m_rhs * auVar85._0_8_ * local_da8;
      auVar86 = vfmadd231sd_fma(auVar171,auVar149,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dStack_d90;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = (double)local_ea8.m_rhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar102,auVar86,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_db8;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = (double)local_ed8.m_data * dVar114;
      auVar86 = vfnmadd132sd_fma(auVar142,auVar86,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dStack_da0;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar85._0_8_ * dVar114;
      auVar86 = vfnmadd132sd_fma(auVar103,auVar86,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_d88;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = (double)local_ed8.m_cols * dVar114;
      auVar86 = vfnmadd132sd_fma(auVar118,auVar86,auVar10);
      local_c48.m_data[sVar79] = auVar86._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_db8;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_data;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_rows * dStack_da0;
      auVar86 = vfmadd231sd_fma(auVar159,auVar150,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_d88;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar132,auVar86,auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_dc8._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = (double)local_ed8.m_data * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar104,auVar86,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dStack_db0;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = (double)local_ed8.m_rows * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar119,auVar86,auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_d98;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = (double)local_ed8.m_cols * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar105,auVar86,auVar15);
      local_c48.m_data[sVar79 + local_c48.m_rows] = auVar86._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_dc8._0_8_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_data;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_rows * dStack_db0;
      auVar86 = vfmadd231sd_fma(auVar160,auVar151,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_d98;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar120,auVar86,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_dc8._8_8_;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = (double)local_ed8.m_data * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar133,auVar86,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_da8;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = (double)local_ed8.m_rows * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar121,auVar86,auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dStack_d90;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (double)local_ed8.m_cols * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar106,auVar86,auVar20);
      local_c48.m_data[sVar79 + local_c48.m_rows * 2] = auVar86._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar152._8_8_ = 0;
      auVar152._0_8_ = (double)local_ea8.m_rhs * (double)local_ed8.m_data;
      auVar161._8_8_ = 0;
      auVar161._0_8_ =
           (double)local_ea8.m_rhs * (double)local_ed8.m_rows *
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar86 = vfmadd231sd_fma(auVar161,auVar152,auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar122._8_8_ = 0;
      auVar122._0_8_ = (double)local_ea8.m_rhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar122,auVar86,auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar134._8_8_ = 0;
      auVar134._0_8_ = (double)local_ed8.m_data * (double)local_ea8.m_lhs.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar134,auVar86,auVar23);
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar123._8_8_ = 0;
      auVar123._0_8_ = (double)local_ed8.m_rows * (double)local_ea8.m_lhs.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar123,auVar86,auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar107._8_8_ = 0;
      auVar107._0_8_ = (double)local_ed8.m_cols * (double)local_ea8.m_lhs.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar107,auVar86,auVar25);
      local_c68.m_data[sVar79] = auVar86._0_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_data;
      auVar162._8_8_ = 0;
      auVar162._0_8_ =
           (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_rows *
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar86 = vfmadd231sd_fma(auVar162,auVar153,auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar135._8_8_ = 0;
      auVar135._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar135,auVar86,auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar108._8_8_ = 0;
      auVar108._0_8_ = (double)local_ed8.m_data * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar108,auVar86,auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = (double)local_ed8.m_rows * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar124,auVar86,auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = (double)local_ed8.m_cols * (double)local_ea8.m_rhs;
      auVar86 = vfnmadd132sd_fma(auVar109,auVar86,auVar30);
      local_c68.m_data[sVar79 + local_c68.m_rows] = auVar86._0_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar154._8_8_ = 0;
      auVar154._0_8_ = (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_data;
      auVar163._8_8_ = 0;
      auVar163._0_8_ =
           (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_rows *
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar86 = vfmadd231sd_fma(auVar163,auVar154,auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar125._8_8_ = 0;
      auVar125._0_8_ = (double)local_ea8.m_lhs.m_rhs * (double)local_ed8.m_cols;
      auVar86 = vfmadd132sd_fma(auVar125,auVar86,auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar136._8_8_ = 0;
      auVar136._0_8_ = (double)local_ed8.m_data * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar136,auVar86,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar126._8_8_ = 0;
      auVar126._0_8_ = (double)local_ed8.m_rows * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar126,auVar86,auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar110._8_8_ = 0;
      auVar110._0_8_ = (double)local_ed8.m_cols * (double)local_ea8.m_lhs.m_lhs;
      auVar86 = vfnmadd132sd_fma(auVar110,auVar86,auVar35);
      local_c68.m_data[sVar79 + local_c68.m_rows * 2] = auVar86._0_8_;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_e68.m_data;
      auVar111._8_8_ = local_e68.m_cols;
      auVar111._0_8_ = local_e68.m_cols;
      auVar57._8_8_ = local_ea8.m_rhs;
      auVar57._0_8_ = local_ea8.m_lhs.m_rhs;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_ea8.m_lhs.m_lhs;
      auVar172._8_8_ = local_ea8.m_rhs;
      auVar172._0_8_ = local_ea8.m_rhs;
      auVar58._8_8_ = local_e68.m_cols;
      auVar58._0_8_ = local_e68.m_rows;
      auVar56._8_8_ = local_ed8.m_cols;
      auVar56._0_8_ = local_ed8.m_rows;
      auVar184._8_8_ = local_ed8.m_cols;
      auVar184._0_8_ = local_ed8.m_cols;
      auVar61._8_8_ = local_da8;
      auVar61._0_8_ = dStack_db0;
      auVar62._8_8_ = dStack_d90;
      auVar62._0_8_ = local_d98;
      lVar84 = lVar84 + 0x100000000;
      auVar86 = vunpcklpd_avx(auVar111,auVar137);
      auVar164._0_8_ = (double)local_ea8.m_lhs.m_rhs * auVar86._0_8_;
      auVar164._8_8_ = (double)local_ea8.m_rhs * auVar86._8_8_;
      auVar86 = vunpcklpd_avx(auVar172,auVar127);
      auVar43 = vfmsub213pd_fma(auVar86,auVar58,auVar164);
      auVar143._8_8_ = 0;
      auVar143._0_8_ =
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar165._8_8_ =
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar165._0_8_ =
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar128._8_8_ = 0;
      auVar128._0_8_ = (double)local_ea8.m_lhs.m_lhs * (double)local_e68.m_rows;
      auVar115 = vfmsub231sd_fma(auVar128,auVar137,auVar57);
      auVar138._8_8_ = 0;
      auVar138._0_8_ = local_ed8.m_data;
      auVar63._8_8_ =
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar63._0_8_ =
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar86 = vunpcklpd_avx(auVar165,auVar143);
      auVar85 = vunpcklpd_avx(auVar184,auVar138);
      auVar166._0_8_ = (double)local_ed8.m_rows * auVar86._0_8_;
      auVar166._8_8_ = (double)local_ed8.m_cols * auVar86._8_8_;
      local_d68 = vfmsub213pd_fma(auVar85,auVar63,auVar166);
      auVar155._8_8_ = 0;
      auVar155._0_8_ =
           (double)local_ed8.m_data *
           local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar86 = vfmsub231sd_fma(auVar155,auVar56,auVar143);
      dVar114 = local_d68._0_8_;
      local_d58[0] = auVar86._0_8_;
      auVar199._8_8_ = local_d68._8_8_;
      auVar199._0_8_ = local_d68._8_8_;
      auVar205._8_8_ = local_d58[0];
      auVar205._0_8_ = local_d58[0];
      auVar167._0_8_ = (double)local_dc8._0_8_ * dVar114;
      auVar167._8_8_ = (double)local_dc8._8_8_ * dVar114;
      auVar51._8_8_ = local_ed8.m_data;
      auVar51._0_8_ = local_ed8.m_data;
      auVar86 = vmulpd_avx512vl(local_dc8,auVar51);
      auVar52._8_8_ = local_ed8.m_rows;
      auVar52._0_8_ = local_ed8.m_rows;
      auVar85 = vfmadd231pd_avx512vl(auVar86,auVar61,auVar52);
      auVar86 = vfmadd231pd_fma(auVar167,auVar61,auVar199);
      auVar210._8_8_ = 0;
      auVar210._0_8_ = dStack_da0;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = local_d68._8_8_;
      auVar87 = vmulsd_avx512f(auVar211,auVar210);
      auVar212._8_8_ = 0;
      auVar212._0_8_ = local_d88;
      auVar88 = vmulsd_avx512f(auVar205,auVar212);
      auVar87 = vaddsd_avx512f(auVar87,auVar88);
      auVar86 = vfmadd231pd_fma(auVar86,auVar62,auVar205);
      auVar209._8_8_ = 0;
      auVar209._0_8_ = dVar114 * local_db8;
      auVar87 = vaddsd_avx512f(auVar209,auVar87);
      auVar85 = vfmadd231pd_fma(auVar85,auVar184,auVar62);
      auVar88 = vmulsd_avx512f(auVar210,auVar56);
      auVar89 = vmulsd_avx512f(auVar212,auVar184);
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
         local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ->m_storage).m_data)[sVar79] =
           (double *)
           ((double)((ulong)local_e88 ^
                    (ulong)(auVar86._0_8_ * (double)local_ea8.m_lhs.m_lhs +
                            auVar86._8_8_ * (double)local_ea8.m_lhs.m_rhs +
                           auVar87._0_8_ * (double)local_ea8.m_rhs)) -
           (auVar115._0_8_ * (local_db8 * (double)local_ed8.m_data + auVar88._0_8_ + auVar89._0_8_)
           + auVar43._0_8_ * auVar85._0_8_ + auVar43._8_8_ * auVar85._8_8_));
      auVar185._8_8_ = 0;
      auVar185._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar60._8_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar60._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar144._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] * dVar114;
      auVar144._8_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] * dVar114;
      auVar59._8_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar59._0_8_ =
           local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar87 = vmulsd_avx512f(auVar211,auVar185);
      auVar53._8_8_ = local_ed8.m_data;
      auVar53._0_8_ = local_ed8.m_data;
      auVar86 = vmulpd_avx512vl((undefined1  [16])
                                local_e18.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array._0_16_,auVar53);
      auVar54._8_8_ = local_ed8.m_rows;
      auVar54._0_8_ = local_ed8.m_rows;
      auVar85 = vfmadd231pd_avx512vl(auVar86,auVar59,auVar54);
      auVar86 = vfmadd231pd_fma(auVar144,auVar59,auVar199);
      auVar156._8_8_ = local_ed8.m_cols;
      auVar156._0_8_ = local_ed8.m_cols;
      auVar86 = vfmadd231pd_fma(auVar86,auVar60,auVar205);
      auVar85 = vfmadd231pd_fma(auVar85,auVar156,auVar60);
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ->m_storage).m_data)[sVar79] =
           (double *)
           ((double)((ulong)local_e88 ^
                    (ulong)(auVar86._0_8_ * (double)local_ea8.m_lhs.m_lhs +
                            auVar86._8_8_ * (double)local_ea8.m_lhs.m_rhs +
                           (auVar87._0_8_ +
                            local_d58[0] *
                            local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[8] +
                           dVar114 * local_e18.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[2]) * (double)local_ea8.m_rhs)) -
           (auVar115._0_8_ *
            (local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] * (double)local_ed8.m_data +
            local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] * (double)local_ed8.m_rows +
            local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] * (double)local_ed8.m_cols) +
           auVar43._0_8_ * auVar85._0_8_ + auVar43._8_8_ * auVar85._8_8_));
      sVar79 = sVar79 + 1;
    } while (local_e48 != (double)sVar79);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68,
             (MatrixType *)&local_c48,0x28);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_d78,&local_b38);
  local_e88 = (undefined1 (*) [16])(local_ca0 * *local_d78.m_data);
  local_ed8.m_cols = 0;
  local_ed8.m_data = (double *)0x0;
  local_ed8.m_rows = 0;
  lVar84 = 9;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ed8,9,3,3);
  dVar114 = local_eb0;
  if ((local_ed8.m_rows == 3) && (local_ed8.m_cols == 3)) {
LAB_001375e3:
    memset(local_ed8.m_data,0,lVar84 << 3);
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ed8,9,3,3);
    lVar84 = local_ed8.m_cols * local_ed8.m_rows;
    if (0 < lVar84) goto LAB_001375e3;
  }
  lVar84 = 0;
  pdVar72 = local_ed8.m_data;
  do {
    if ((double)local_e88 * 2.220446049250313e-16 < local_d78.m_data[lVar84]) {
      *pdVar72 = 1.0 / local_d78.m_data[lVar84];
    }
    lVar84 = lVar84 + 1;
    pdVar72 = pdVar72 + local_ed8.m_rows + 1;
  } while (lVar84 != 3);
  local_e68.m_cols = 0;
  local_e68.m_data = (double *)0x0;
  local_e68.m_rows = 0;
  if ((local_e48 != 0.0) &&
     (auVar86 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar86 / SEXT816((long)local_e48),0) < 3)) {
    puVar73 = (undefined8 *)
              __cxa_allocate_exception(8,3,SUB168(auVar86 % SEXT816((long)local_e48),0));
    *puVar73 = acos;
    __cxa_throw(puVar73,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e68,(Index)dVar114,3,(Index)local_e48);
  local_8f8._0_8_ = &local_b50;
  local_8f8._8_8_ = &local_ed8;
  local_8f8._16_8_ = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_e68,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_8f8,(assign_op<double,_double> *)&local_ea8,(type)0x0);
  local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  if ((RhsNested)local_e68.m_rows == (RhsNested)0x1) {
    local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    if ((local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != 0) &&
       (local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                            local_e68.m_data)->m_storage).m_data *
                   (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                            local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            .m_storage.m_data)->m_storage).m_data,
       1 < local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       )) {
      sVar79 = 1;
      do {
        ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e68.m_data)
                   ->m_storage).m_data + sVar79;
        ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data)->m_storage).m_data + sVar79;
        sVar79 = sVar79 + 1;
        local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] + (double)*ppdVar2 * (double)*ppdVar3;
      } while (local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows != sVar79);
    }
    local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] + 0.0;
  }
  else {
    local_8f8._0_8_ = local_e68.m_data;
    local_ea8.m_lhs.m_lhs =
         (LhsNested)
         local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_8f8._8_8_ = local_e68.m_rows;
    local_ea8.m_lhs.m_rhs = (RhsNested)0x1;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_e68.m_rows,local_e68.m_cols,(const_blas_data_mapper<double,_long,_0> *)local_8f8,
          (const_blas_data_mapper<double,_long,_1> *)&local_ea8,(ResScalar *)&local_d08,1,1.0);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_8f8,
             (MatrixType *)&local_c68,0x28);
  if (local_d78.m_rows != uStack_8c0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d78,uStack_8c0,1);
    uStack_8c0 = local_d78.m_rows;
  }
  uVar80 = uStack_8c0 + 7;
  if (-1 < (long)uStack_8c0) {
    uVar80 = uStack_8c0;
  }
  uVar80 = uVar80 & 0xfffffffffffffff8;
  if (7 < (long)uStack_8c0) {
    lVar84 = 0;
    do {
      pdVar1 = local_8c8 + lVar84;
      dVar114 = pdVar1[1];
      dVar69 = pdVar1[2];
      dVar74 = pdVar1[3];
      dVar145 = pdVar1[4];
      dVar174 = pdVar1[5];
      dVar186 = pdVar1[6];
      dVar188 = pdVar1[7];
      pdVar72 = local_d78.m_data + lVar84;
      *pdVar72 = *pdVar1;
      pdVar72[1] = dVar114;
      pdVar72[2] = dVar69;
      pdVar72[3] = dVar74;
      pdVar72[4] = dVar145;
      pdVar72[5] = dVar174;
      pdVar72[6] = dVar186;
      pdVar72[7] = dVar188;
      lVar84 = lVar84 + 8;
    } while (lVar84 < (long)uVar80);
  }
  if ((long)uVar80 < (long)uStack_8c0) {
    do {
      local_d78.m_data[uVar80] = local_8c8[uVar80];
      uVar80 = uVar80 + 1;
    } while (uStack_8c0 != uVar80);
  }
  local_e48 = local_ca0 * *local_d78.m_data;
  if ((local_ed8.m_rows != 3) || (lVar84 = 9, local_ed8.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ed8,9,3,3);
    lVar84 = local_ed8.m_cols * local_ed8.m_rows;
    if (lVar84 < 1) goto LAB_0013789f;
  }
  memset(local_ed8.m_data,0,lVar84 << 3);
LAB_0013789f:
  lVar84 = 0;
  pdVar72 = local_ed8.m_data;
  do {
    if (local_e48 * 2.220446049250313e-16 < local_d78.m_data[lVar84]) {
      *pdVar72 = 1.0 / local_d78.m_data[lVar84];
    }
    lVar84 = lVar84 + 1;
    pdVar72 = pdVar72 + local_ed8.m_rows + 1;
  } while (lVar84 != 3);
  local_ea8.m_lhs.m_lhs = &local_8e0;
  local_ea8.m_lhs.m_rhs = (RhsNested)&local_ed8;
  local_ea8.m_rhs = (RhsNested)local_8f8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_e68,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_ea8,(assign_op<double,_double> *)local_d68,(type)0x0);
  local_d58[0] = 0.0;
  local_d68 = ZEXT816(0);
  if ((RhsNested)local_e68.m_rows == (RhsNested)0x1) {
    dVar114 = 0.0;
    if ((local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != 0) &&
       (dVar114 = (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           local_e68.m_data)->m_storage).m_data *
                  (double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data)->m_storage).m_data,
       1 < local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       )) {
      sVar79 = 1;
      do {
        ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e68.m_data)
                   ->m_storage).m_data + sVar79;
        ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                    local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data)->m_storage).m_data + sVar79;
        sVar79 = sVar79 + 1;
        dVar114 = dVar114 + (double)*ppdVar2 * (double)*ppdVar3;
      } while (local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows != sVar79);
    }
    local_d68._8_8_ = 0;
    local_d68._0_8_ = dVar114 + 0.0;
  }
  else {
    local_ea8.m_lhs.m_lhs = (LhsNested)local_e68.m_data;
    local_cc8.m_xpr =
         (XprTypeNested)
         local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_ea8.m_lhs.m_rhs = (RhsNested)local_e68.m_rows;
    local_cc8._8_8_ = 1;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_e68.m_rows,local_e68.m_cols,(const_blas_data_mapper<double,_long,_0> *)&local_ea8,
          (const_blas_data_mapper<double,_long,_1> *)&local_cc8,(ResScalar *)local_d68,1,1.0);
  }
  local_ea8.m_rhs = &local_e28;
  local_ea8.m_lhs.m_rhs = &local_d08;
  local_cd8.m_storage.m_data = (double *)0x0;
  local_cd8.m_storage.m_rows = 0;
  local_ea8.m_lhs.m_lhs = (LhsNested)&local_c48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_cd8,
             local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows,1);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_cd8,&local_ea8,
             (assign_op<double,_double> *)&local_cc8);
  local_ea8.m_rhs = &local_e38;
  local_ce8.m_storage.m_data = (double *)0x0;
  local_ce8.m_storage.m_rows = 0;
  local_ea8.m_lhs.m_lhs = (LhsNested)&local_c68;
  local_ea8.m_lhs.m_rhs = (RhsNested)local_d68;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_ce8,
             local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows,1);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_ce8,&local_ea8,
             (assign_op<double,_double> *)&local_cc8);
  ptVar67 = local_b90;
  uVar113 = 0;
  SVar97 = 0.0;
  if (local_cd8.m_storage.m_rows != 0) {
    local_ea8.m_lhs.m_rhs = (RhsNested)local_cd8.m_storage.m_data;
    local_cc8.m_xpr = (XprTypeNested)&local_cd8;
    SVar97 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_ea8,&local_eb1,&local_cc8);
    uVar113 = extraout_XMM0_Qb;
  }
  auVar86 = SUB6416(ZEXT864(0),0) << 0x40;
  local_cc8.m_xpr = (XprTypeNested)&local_ce8;
  if (local_ce8.m_storage.m_rows != 0) {
    local_ea8.m_lhs.m_rhs = (RhsNested)local_ce8.m_storage.m_data;
    local_e48 = SVar97;
    uStack_e40 = uVar113;
    auVar90._0_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
         ::
         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&local_ea8,&local_eb1,&local_cc8);
    auVar90._8_56_ = extraout_var;
    auVar86 = auVar90._0_16_;
    SVar97 = local_e48;
  }
  lVar84 = 0x10;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = SVar97;
  auVar85 = vsqrtpd_avx(auVar112);
  auVar86 = vsqrtsd_avx(auVar86,auVar86);
  if (auVar86._0_8_ <= auVar85._0_8_) {
    do {
      uVar55 = *(undefined8 *)
                ((long)local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar84 + -8);
      uVar113 = *(undefined8 *)
                 ((long)local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar84);
      puVar73 = (undefined8 *)
                ((long)(ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                       m_storage.m_data.array + lVar84 + -0x10);
      *puVar73 = *(undefined8 *)
                  ((long)local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar84 + -0x10);
      puVar73[1] = uVar55;
      *(undefined8 *)
       ((long)(ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
              m_data.array + lVar84) = uVar113;
      lVar84 = lVar84 + 0x18;
    } while (lVar84 != 0x58);
    pdVar72 = local_d58;
    dVar114 = (double)local_d68._0_8_;
    dVar69 = (double)local_d68._8_8_;
  }
  else {
    do {
      uVar55 = *(undefined8 *)((long)&dStack_dd0 + lVar84);
      uVar113 = *(undefined8 *)(local_dc8 + lVar84);
      puVar73 = (undefined8 *)
                ((long)(ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                       m_storage.m_data.array + lVar84 + -0x10);
      *puVar73 = *(undefined8 *)
                  ((long)local_e18.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar84 + 0x40);
      puVar73[1] = uVar55;
      *(undefined8 *)
       ((long)(ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
              m_data.array + lVar84) = uVar113;
      lVar84 = lVar84 + 0x18;
    } while (lVar84 != 0x58);
    pdVar72 = local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2;
    dVar114 = local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
    dVar69 = local_d08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[1];
  }
  (ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array[9]
       = dVar114;
  (ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array[10]
       = dVar69;
  (ptVar67->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
  [0xb] = *pdVar72;
  if ((assign_op<double,_double> *)local_ce8.m_storage.m_data != (assign_op<double,_double> *)0x0) {
    free(*(void **)((long)local_ce8.m_storage.m_data + -8));
  }
  if ((assign_op<double,_double> *)local_cd8.m_storage.m_data != (assign_op<double,_double> *)0x0) {
    free(*(void **)((long)local_cd8.m_storage.m_data + -8));
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_8f8);
  if ((Matrix<double,__1,__1,_0,__1,__1> *)local_e68.m_data !=
      (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
    free((void *)(((Matrix<double,__1,__1,_0,__1,__1> *)((long)local_e68.m_data + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  if (local_ed8.m_data != (double *)0x0) {
    free((void *)local_ed8.m_data[-1]);
  }
  if (local_d78.m_data != (double *)0x0) {
    free((void *)local_d78.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68);
  if ((XprTypeNested)
      local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (XprTypeNested)0x0) {
    free((void *)(((XprTypeNested)
                  ((long)local_e38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data + -0x10))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows);
  }
  if ((LhsNested)
      local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (LhsNested)0x0) {
    free((void *)(((LhsNested)
                  ((long)local_e28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  if (local_c68.m_data != (double *)0x0) {
    free((void *)local_c68.m_data[-1]);
  }
  if (local_c48.m_data != (double *)0x0) {
    free((void *)local_c48.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_4b8);
  if ((undefined1 (*) [16])local_c08.m_data != (undefined1 (*) [16])0x0) {
    free(*(void **)(*(undefined1 (*) [16])((long)local_c08.m_data + -0x10) + 8));
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_6d8);
  if (local_b80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_b80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_d48.m_data != (double *)0x0) {
    free((void *)local_d48.m_data[-1]);
  }
  if (local_c28.m_data != (double *)0x0) {
    free((void *)local_c28.m_data[-1]);
  }
  if (local_d28.m_data != (double *)0x0) {
    free((void *)local_d28.m_data[-1]);
  }
  if (local_c78.m_data != (double *)0x0) {
    free((void *)local_c78.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298);
  if (local_c98.m_data != (double *)0x0) {
    free((void *)local_c98.m_data[-1]);
  }
  if (local_cb8.m_data != (double *)0x0) {
    free((void *)local_cb8.m_data[-1]);
  }
  return ptVar67;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size() > 1);
  return twopt_rotationOnly( adapter, indices[0], indices[1] );
}